

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall IR::Instr::FetchOperands(Instr *this,Opnd **argsOpnd,uint argsOpndLength)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  StackSym *this_00;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ArgSlot AVar6;
  uint uVar7;
  undefined4 *puVar8;
  Opnd *pOVar9;
  
  if (this->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                       "this->m_opcode == Js::OpCode::CallDirect");
    if (!bVar4) goto LAB_004bd0ed;
    *puVar8 = 0;
  }
  pOVar9 = this->m_src2;
  OVar5 = Opnd::GetKind(pOVar9);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_004bd0ed;
    *puVar8 = 0;
  }
  pp_Var1 = pOVar9[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_004bd0ed;
    *puVar8 = 0;
  }
  p_Var2 = pp_Var1[5];
  if (*(short *)(p_Var2 + 0x30) != 0x1ef) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                       "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
    if (!bVar4) goto LAB_004bd0ed;
    *puVar8 = 0;
  }
  pOVar9 = *(Opnd **)(p_Var2 + 0x50);
  OVar5 = Opnd::GetKind(pOVar9);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_004bd0ed;
    *puVar8 = 0;
  }
  this_00 = (StackSym *)pOVar9[1]._vptr_Opnd;
  if ((this_00->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) {
LAB_004bd0ed:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  AVar6 = StackSym::GetArgSlotNum(this_00);
  uVar7 = (uint)AVar6;
  if (AVar6 == argsOpndLength) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      OVar5 = Opnd::GetKind(pOVar9);
      bVar4 = uVar7 != 0 && OVar5 == OpndKindSym;
      if (uVar7 == 0 || OVar5 != OpndKindSym) break;
      OVar5 = Opnd::GetKind(pOVar9);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_004bd0ed;
        *puVar8 = 0;
      }
      pp_Var1 = pOVar9[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_004bd0ed;
        *puVar8 = 0;
      }
      if (((ulong)pp_Var1[3] & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar4) goto LAB_004bd0ed;
        *puVar8 = 0;
      }
      p_Var2 = pp_Var1[5];
      if (*(short *)(p_Var2 + 0x30) != 0x59) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                           "argInstr->m_opcode == Js::OpCode::ArgOut_A");
        if (!bVar4) goto LAB_004bd0ed;
        *puVar8 = 0;
      }
      uVar7 = uVar7 - 1;
      argsOpnd[uVar7] = *(Opnd **)(p_Var2 + 0x48);
      if (uVar7 == 0) {
        return true;
      }
      pOVar9 = *(Opnd **)(p_Var2 + 0x50);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
Instr::FetchOperands(_Out_writes_(argsOpndLength) IR::Opnd **argsOpnd, uint argsOpndLength)
{
    return this->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
    {
        argsOpnd[argNum] = argOutInstr->GetSrc1();
        return argNum == 0;
    }, argsOpndLength);
}